

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<std::pair<double,_QVariant>_>::relocate
          (QArrayDataPointer<std::pair<double,_QVariant>_> *this,qsizetype offset,
          pair<double,_QVariant> **data)

{
  bool bVar1;
  pair<double,_QVariant> *first;
  long *in_RDX;
  long in_RSI;
  long in_RDI;
  pair<double,_QVariant> *res;
  
  first = (pair<double,_QVariant> *)(*(long *)(in_RDI + 8) + in_RSI * 0x28);
  QtPrivate::q_relocate_overlap_n<std::pair<double,QVariant>,long_long>
            (first,in_RDI,(pair<double,_QVariant> *)0x696304);
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<std::pair<double,QVariant>>,std::pair<double,QVariant>const*>
                        (data,(QArrayDataPointer<std::pair<double,_QVariant>_> *)res), bVar1)) {
    *in_RDX = in_RSI * 0x28 + *in_RDX;
  }
  *(pair<double,_QVariant> **)(in_RDI + 8) = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }